

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O3

bool __thiscall
Kernel::InterpretedLiteralEvaluator::
ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)25>_>::tryEvaluateFunc
          (ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)25>_> *this,Term *trm
          ,TermList *res)

{
  anon_class_24_3_b5a48c42 action;
  TermList *pTVar1;
  int iVar2;
  Term *pTVar3;
  TermList arg2;
  ulong uVar4;
  TermList *pTVar5;
  bool bVar6;
  uint nums;
  ConstantType acc;
  int local_7c;
  __mpz_struct local_78;
  Stack<Kernel::TermList> local_68;
  __mpz_struct *local_40;
  int *piStack_38;
  Stack<Kernel::TermList> *local_30;
  
  local_7c = 0;
  IntegerConstantType::IntegerConstantType
            ((IntegerConstantType *)&local_78,
             (IntegerConstantType *)AbelianGroup<(Kernel::Theory::Interpretation)25>::IDENTITY);
  local_30 = &local_68;
  local_68._cursor = (TermList *)0x0;
  local_68._end = (TermList *)0x0;
  local_68._capacity = 0;
  local_68._stack = (TermList *)0x0;
  action.nums = (uint *)&local_7c;
  action.acc = (ConstantType *)&local_78;
  action.keep = local_30;
  local_40 = &local_78;
  piStack_38 = &local_7c;
  stackTraverseIf<Kernel::InterpretedLiteralEvaluator::ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)25>>::tryEvaluateFunc(Kernel::Term*,Kernel::TermList&)::_lambda(Kernel::TermList)_1_,Kernel::InterpretedLiteralEvaluator::ACFunEvaluator<Kernel::AbelianGroup<(Kernel::Theory::Interpretation)25>>::tryEvaluateFunc(Kernel::Term*,Kernel::TermList&)::_lambda(Kernel::Term&)_1_>
            ((TermList)trm,(anon_class_8_1_8991fb9c)this,action);
  if ((local_7c == 0) ||
     ((local_7c == 1 &&
      (iVar2 = mpz_cmp(&local_78,
                       (__mpz_struct *)AbelianGroup<(Kernel::Theory::Interpretation)25>::IDENTITY),
      iVar2 != 0)))) {
    bVar6 = false;
  }
  else {
    iVar2 = mpz_cmp(&local_78,
                    (__mpz_struct *)AbelianGroup<(Kernel::Theory::Interpretation)25>::IDENTITY);
    if (iVar2 != 0) {
      pTVar3 = Theory::representConstant((Theory *)theory,(IntegerConstantType *)&local_78);
      if (local_68._cursor == local_68._end) {
        Lib::Stack<Kernel::TermList>::expand(&local_68);
      }
      (local_68._cursor)->_content = (uint64_t)pTVar3;
      local_68._cursor = local_68._cursor + 1;
    }
    pTVar1 = local_68._cursor;
    if (local_68._stack == local_68._cursor) {
      arg2._content =
           (uint64_t)
           Theory::representConstant
                     ((Theory *)theory,
                      (IntegerConstantType *)
                      AbelianGroup<(Kernel::Theory::Interpretation)25>::IDENTITY);
    }
    else {
      arg2._content = (local_68._stack)->_content;
      pTVar5 = local_68._stack;
      while (pTVar5 = pTVar5 + 1, pTVar5 != pTVar1) {
        arg2._content = (uint64_t)Term::create2(this->_fun,pTVar5->_content,arg2);
      }
    }
    res->_content = (uint64_t)arg2;
    bVar6 = (Term *)arg2._content != trm;
  }
  if (local_68._stack != (TermList *)0x0) {
    uVar4 = local_68._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar4 == 0) {
      (local_68._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_68._stack;
    }
    else if (uVar4 < 0x11) {
      (local_68._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_68._stack;
    }
    else if (uVar4 < 0x19) {
      (local_68._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_68._stack;
    }
    else if (uVar4 < 0x21) {
      (local_68._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_68._stack;
    }
    else if (uVar4 < 0x31) {
      (local_68._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_68._stack;
    }
    else if (uVar4 < 0x41) {
      (local_68._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_68._stack;
    }
    else {
      operator_delete(local_68._stack,0x10);
    }
  }
  mpz_clear(&local_78);
  return bVar6;
}

Assistant:

virtual bool tryEvaluateFunc(Term* trm, TermList& res) { 
    ASS_EQ(trm->functor(), _fun);
    ASS_EQ(trm->numTermArguments(),2);

    unsigned nums = 0;
    ConstantType acc = AbelianGroup::IDENTITY;
    Stack<TermList> keep;
    stackTraverseIf(TermList(trm), 
        /* we traverse only the parts with the same operation */
        [&](Term& t){ return t.functor() == _fun; },
        [&](TermList t) {
          ConstantType c;
          /* we eval constant parts */
          if (t.isTerm() && theory->tryInterpretConstant(t.term(), c)) {
            acc = AbelianGroup::groundEval(acc, c);
            nums++;
          } else {
            keep.push(t);
          }
        });
    if (nums == 0 || (nums == 1 && acc != AbelianGroup::IDENTITY)) {
      // only continue, if we updated acc more than once or at least saw a "_+0" somewhere
      return false;
    }

    if (acc != AbelianGroup::IDENTITY) {
      keep.push(TermList(theory->representConstant(acc)));
    }

    auto iter = Stack<TermList>::BottomFirstIterator(keep);
    if (!iter.hasNext()) {
      res = TermList(theory->representConstant(AbelianGroup::IDENTITY));
      return TermList(trm) != res;
    } else {
      TermList out = iter.next();
      while (iter.hasNext()) {
        auto t = iter.next();
        out = TermList(Term::create2(_fun, t, out));
      }
      res = out;
      return TermList(trm) != res;
    }
  }